

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

bool __thiscall
flatbuffers::anon_unknown_0::CompareSerializedScalars
          (anon_unknown_0 *this,uint8_t *a,uint8_t *b,FieldDef *key)

{
  char cVar1;
  bool bVar2;
  anon_unknown_0 aVar3;
  short sVar4;
  ushort uVar5;
  int iVar6;
  uint uVar7;
  FieldDef *pFVar8;
  FieldDef **ppFVar9;
  byte *pbVar10;
  longlong lVar11;
  ulong uVar12;
  byte bVar13;
  anon_unknown_0 aVar14;
  short sVar15;
  ushort uVar16;
  uint uVar17;
  longlong lVar18;
  ulong uVar19;
  char *pcVar20;
  int iVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  double dVar25;
  double dVar26;
  int64_t def;
  FieldDef *local_28;
  
  local_28 = key;
  switch((ulong)b & 0xffffffff) {
  case 0:
    if (this == (anon_unknown_0 *)0x0 || a == (uint8_t *)0x0) {
      if (key == (FieldDef *)0x0) {
LAB_0012552c:
        pcVar20 = "bool flatbuffers::StringToNumber(const char *, T *) [T = unsigned char]";
LAB_00125541:
        __assert_fail("s && val",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                      ,0x14b,pcVar20);
      }
      bVar13 = *(byte *)&(key->super_Definition).name._M_dataplus._M_p;
      if (bVar13 != 0) {
        pbVar10 = (byte *)((long)&(key->super_Definition).name._M_dataplus._M_p + 1);
        do {
          if ((int)(char)bVar13 - 0x30U < 10) goto LAB_00125181;
          bVar13 = *pbVar10;
          pbVar10 = pbVar10 + 1;
        } while (bVar13 != 0);
      }
LAB_001251ac:
      iVar21 = 10;
      goto LAB_001251c8;
    }
    break;
  case 1:
    if (this == (anon_unknown_0 *)0x0 || a == (uint8_t *)0x0) {
      if (key == (FieldDef *)0x0) goto LAB_0012552c;
      bVar13 = *(byte *)&(key->super_Definition).name._M_dataplus._M_p;
      if (bVar13 != 0) {
        pbVar10 = (byte *)((long)&(key->super_Definition).name._M_dataplus._M_p + 1);
        do {
          if ((int)(char)bVar13 - 0x30U < 10) goto LAB_00125181;
          bVar13 = *pbVar10;
          pbVar10 = pbVar10 + 1;
        } while (bVar13 != 0);
      }
      goto LAB_001251ac;
    }
    break;
  case 2:
    if (this == (anon_unknown_0 *)0x0 || a == (uint8_t *)0x0) {
      if (key == (FieldDef *)0x0) goto LAB_0012552c;
      bVar13 = *(byte *)&(key->super_Definition).name._M_dataplus._M_p;
      if (bVar13 != 0) {
        pbVar10 = (byte *)((long)&(key->super_Definition).name._M_dataplus._M_p + 1);
        do {
          if ((int)(char)bVar13 - 0x30U < 10) goto LAB_00125181;
          bVar13 = *pbVar10;
          pbVar10 = pbVar10 + 1;
        } while (bVar13 != 0);
      }
      goto LAB_001251ac;
    }
    break;
  case 3:
    if (this == (anon_unknown_0 *)0x0 || a == (uint8_t *)0x0) {
      if (key == (FieldDef *)0x0) {
        pcVar20 = "bool flatbuffers::StringToNumber(const char *, T *) [T = signed char]";
        goto LAB_00125541;
      }
      bVar13 = *(byte *)&(key->super_Definition).name._M_dataplus._M_p;
      if (bVar13 != 0) {
        pbVar10 = (byte *)((long)&(key->super_Definition).name._M_dataplus._M_p + 1);
        do {
          if ((int)(char)bVar13 - 0x30U < 10) {
            if ((bVar13 == 0x30) && ((*pbVar10 & 0xdf) == 0x58)) {
              iVar21 = 0x10;
              goto LAB_001252b5;
            }
            break;
          }
          bVar13 = *pbVar10;
          pbVar10 = pbVar10 + 1;
        } while (bVar13 != 0);
      }
      iVar21 = 10;
LAB_001252b5:
      lVar11 = strtoll_l((char *)key,(char **)&local_28,iVar21,ClassicLocale::instance_);
      lVar18 = 0;
      if ((((local_28 != key) &&
           (*(char *)&(local_28->super_Definition).name._M_dataplus._M_p == '\0')) &&
          (lVar18 = 0x7f, lVar11 < 0x80)) && (lVar18 = -0x80, -0x80 < lVar11)) {
        lVar18 = lVar11;
      }
      aVar3 = SUB81(lVar18,0);
      aVar14 = aVar3;
      if (this != (anon_unknown_0 *)0x0) goto LAB_001252e8;
    }
    else {
      aVar14 = (anon_unknown_0)0x0;
LAB_001252e8:
      aVar3 = *this;
    }
    if (a != (uint8_t *)0x0) {
      aVar14 = (anon_unknown_0)*a;
    }
    bVar22 = SBORROW1((char)aVar3,(char)aVar14);
    bVar2 = (char)((char)aVar3 - (char)aVar14) < '\0';
LAB_0012541a:
    return bVar22 != bVar2;
  case 4:
    if (this == (anon_unknown_0 *)0x0 || a == (uint8_t *)0x0) {
      if (key == (FieldDef *)0x0) goto LAB_0012552c;
      bVar13 = *(byte *)&(key->super_Definition).name._M_dataplus._M_p;
      if (bVar13 != 0) {
        pbVar10 = (byte *)((long)&(key->super_Definition).name._M_dataplus._M_p + 1);
        do {
          if ((int)(char)bVar13 - 0x30U < 10) goto LAB_00125181;
          bVar13 = *pbVar10;
          pbVar10 = pbVar10 + 1;
        } while (bVar13 != 0);
      }
      goto LAB_001251ac;
    }
    break;
  case 5:
    if (this == (anon_unknown_0 *)0x0 || a == (uint8_t *)0x0) {
      if (key == (FieldDef *)0x0) {
        pcVar20 = "bool flatbuffers::StringToNumber(const char *, T *) [T = short]";
        goto LAB_00125541;
      }
      bVar13 = *(byte *)&(key->super_Definition).name._M_dataplus._M_p;
      if (bVar13 != 0) {
        pbVar10 = (byte *)((long)&(key->super_Definition).name._M_dataplus._M_p + 1);
        do {
          if ((int)(char)bVar13 - 0x30U < 10) {
            if ((bVar13 == 0x30) && ((*pbVar10 & 0xdf) == 0x58)) {
              iVar21 = 0x10;
              goto LAB_001253d2;
            }
            break;
          }
          bVar13 = *pbVar10;
          pbVar10 = pbVar10 + 1;
        } while (bVar13 != 0);
      }
      iVar21 = 10;
LAB_001253d2:
      lVar11 = strtoll_l((char *)key,(char **)&local_28,iVar21,ClassicLocale::instance_);
      lVar18 = 0;
      if (((local_28 != key) &&
          (*(char *)&(local_28->super_Definition).name._M_dataplus._M_p == '\0')) &&
         ((lVar18 = 0x7fff, lVar11 < 0x8000 && (lVar18 = -0x8000, -0x8000 < lVar11)))) {
        lVar18 = lVar11;
      }
      sVar4 = (short)lVar18;
      sVar15 = sVar4;
      if (this != (anon_unknown_0 *)0x0) goto LAB_0012540b;
    }
    else {
      sVar15 = 0;
LAB_0012540b:
      sVar4 = *(short *)this;
    }
    if (a != (uint8_t *)0x0) {
      sVar15 = *(short *)a;
    }
    bVar22 = SBORROW2(sVar4,sVar15);
    bVar2 = (short)(sVar4 - sVar15) < 0;
    goto LAB_0012541a;
  case 6:
    if (this == (anon_unknown_0 *)0x0 || a == (uint8_t *)0x0) {
      if (key == (FieldDef *)0x0) {
        pcVar20 = "bool flatbuffers::StringToNumber(const char *, T *) [T = unsigned short]";
        goto LAB_00125541;
      }
      bVar13 = *(byte *)&(key->super_Definition).name._M_dataplus._M_p;
      if (bVar13 != 0) {
        pbVar10 = (byte *)((long)&(key->super_Definition).name._M_dataplus._M_p + 1);
        do {
          if ((int)(char)bVar13 - 0x30U < 10) {
            if ((bVar13 == 0x30) && ((*pbVar10 & 0xdf) == 0x58)) {
              iVar21 = 0x10;
              goto LAB_00125470;
            }
            break;
          }
          bVar13 = *pbVar10;
          pbVar10 = pbVar10 + 1;
        } while (bVar13 != 0);
      }
      iVar21 = 10;
LAB_00125470:
      uVar12 = strtoll_l((char *)key,(char **)&local_28,iVar21,ClassicLocale::instance_);
      uVar19 = 0;
      if (((local_28 != key) &&
          (*(char *)&(local_28->super_Definition).name._M_dataplus._M_p == '\0')) &&
         (uVar19 = 0xffff, uVar12 < 0xffff)) {
        uVar19 = uVar12;
      }
      uVar5 = (ushort)uVar19;
      uVar16 = uVar5;
      if (this == (anon_unknown_0 *)0x0) goto LAB_0012549c;
    }
    else {
      uVar16 = 0;
    }
    uVar5 = *(ushort *)this;
LAB_0012549c:
    if (a != (uint8_t *)0x0) {
      uVar16 = *(ushort *)a;
    }
    return uVar5 < uVar16;
  case 7:
    iVar21 = 0;
    if (this == (anon_unknown_0 *)0x0 || a == (uint8_t *)0x0) {
      if (key == (FieldDef *)0x0) {
        pcVar20 = "bool flatbuffers::StringToNumber(const char *, T *) [T = int]";
        goto LAB_00125541;
      }
      bVar13 = *(byte *)&(key->super_Definition).name._M_dataplus._M_p;
      if (bVar13 != 0) {
        pbVar10 = (byte *)((long)&(key->super_Definition).name._M_dataplus._M_p + 1);
        do {
          if ((int)(char)bVar13 - 0x30U < 10) {
            if ((bVar13 == 0x30) && ((*pbVar10 & 0xdf) == 0x58)) {
              iVar21 = 0x10;
              goto LAB_00125340;
            }
            break;
          }
          bVar13 = *pbVar10;
          pbVar10 = pbVar10 + 1;
        } while (bVar13 != 0);
      }
      iVar21 = 10;
LAB_00125340:
      lVar11 = strtoll_l((char *)key,(char **)&local_28,iVar21,ClassicLocale::instance_);
      lVar18 = 0;
      if (((local_28 != key) &&
          (*(char *)&(local_28->super_Definition).name._M_dataplus._M_p == '\0')) &&
         ((lVar18 = 0x7fffffff, lVar11 < 0x80000000 && (lVar18 = -0x80000000, -0x80000000 < lVar11))
         )) {
        lVar18 = lVar11;
      }
      iVar6 = (int)lVar18;
      iVar21 = iVar6;
      if (this != (anon_unknown_0 *)0x0) goto LAB_0012537a;
    }
    else {
LAB_0012537a:
      iVar6 = *(int *)this;
    }
    if (a != (uint8_t *)0x0) {
      iVar21 = *(int *)a;
    }
    bVar22 = SBORROW4(iVar6,iVar21);
    bVar2 = iVar6 - iVar21 < 0;
    goto LAB_0012541a;
  case 8:
    uVar17 = 0;
    if (this == (anon_unknown_0 *)0x0 || a == (uint8_t *)0x0) {
      if (key == (FieldDef *)0x0) {
        pcVar20 = "bool flatbuffers::StringToNumber(const char *, T *) [T = unsigned int]";
        goto LAB_00125541;
      }
      bVar13 = *(byte *)&(key->super_Definition).name._M_dataplus._M_p;
      if (bVar13 != 0) {
        pbVar10 = (byte *)((long)&(key->super_Definition).name._M_dataplus._M_p + 1);
        do {
          if ((int)(char)bVar13 - 0x30U < 10) {
            if ((bVar13 == 0x30) && ((*pbVar10 & 0xdf) == 0x58)) {
              iVar21 = 0x10;
              goto LAB_001254f3;
            }
            break;
          }
          bVar13 = *pbVar10;
          pbVar10 = pbVar10 + 1;
        } while (bVar13 != 0);
      }
      iVar21 = 10;
LAB_001254f3:
      uVar12 = strtoll_l((char *)key,(char **)&local_28,iVar21,ClassicLocale::instance_);
      uVar19 = 0;
      if (((local_28 != key) &&
          (*(char *)&(local_28->super_Definition).name._M_dataplus._M_p == '\0')) &&
         (uVar19 = 0xffffffff, uVar12 < 0xffffffff)) {
        uVar19 = uVar12;
      }
      uVar7 = (uint)uVar19;
      uVar17 = uVar7;
      if (this == (anon_unknown_0 *)0x0) goto LAB_0012551e;
    }
    uVar7 = *(uint *)this;
LAB_0012551e:
    if (a != (uint8_t *)0x0) {
      uVar17 = *(uint *)a;
    }
    return uVar7 < uVar17;
  case 9:
    local_28 = (FieldDef *)0x0;
    if ((this == (anon_unknown_0 *)0x0 || a == (uint8_t *)0x0) &&
       (StringToIntegerImpl<long>((long *)&local_28,(char *)key,0,true),
       this == (anon_unknown_0 *)0x0)) {
      this = (anon_unknown_0 *)&local_28;
    }
    ppFVar9 = &local_28;
    if (a != (uint8_t *)0x0) {
      ppFVar9 = (FieldDef **)a;
    }
    bVar22 = SBORROW8(*(long *)this,(long)*ppFVar9);
    bVar2 = *(long *)this - (long)*ppFVar9 < 0;
    goto LAB_0012541a;
  case 10:
    local_28 = (FieldDef *)0x0;
    if (this == (anon_unknown_0 *)0x0 || a == (uint8_t *)0x0) {
      bVar2 = StringToIntegerImpl<unsigned_long>((unsigned_long *)&local_28,(char *)key,0,true);
      if ((bVar2) && (local_28 != (FieldDef *)0x0)) {
        pFVar8 = (FieldDef *)((long)&key[-1].sibling_union_field + 7);
        do {
          cVar1 = *(char *)((long)&(pFVar8->super_Definition).name._M_dataplus._M_p + 1);
          pFVar8 = (FieldDef *)((long)&(pFVar8->super_Definition).name._M_dataplus._M_p + 1);
          if (cVar1 == '\0') break;
        } while (9 < (int)cVar1 - 0x30U);
        if (*(char *)((long)pFVar8 - (ulong)(key < pFVar8)) == '-') {
          local_28 = (FieldDef *)0xffffffffffffffff;
        }
      }
      if (this == (anon_unknown_0 *)0x0) {
        this = (anon_unknown_0 *)&local_28;
      }
    }
    ppFVar9 = &local_28;
    if (a != (uint8_t *)0x0) {
      ppFVar9 = (FieldDef **)a;
    }
    return *(ulong *)this < *ppFVar9;
  case 0xb:
    fVar23 = 0.0;
    if (this == (anon_unknown_0 *)0x0 || a == (uint8_t *)0x0) {
      if (key == (FieldDef *)0x0) {
        pcVar20 = "bool flatbuffers::StringToFloatImpl(T *, const char *const) [T = float]";
LAB_00125596:
        __assert_fail("str && val",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                      ,0x138,pcVar20);
      }
      fVar23 = strtof_l((char *)key,(char **)&local_28,ClassicLocale::instance_);
      fVar24 = 0.0;
      if (((local_28 != key) &&
          (*(char *)&(local_28->super_Definition).name._M_dataplus._M_p == '\0')) &&
         (fVar24 = fVar23, NAN(fVar23))) {
        fVar24 = NAN;
      }
      fVar23 = fVar24;
      if (this != (anon_unknown_0 *)0x0) goto LAB_00124e34;
    }
    else {
LAB_00124e34:
      fVar24 = *(float *)this;
    }
    if (a != (uint8_t *)0x0) {
      fVar23 = *(float *)a;
    }
    bVar2 = fVar23 == fVar24;
    bVar22 = fVar23 < fVar24;
LAB_00124f07:
    return !bVar22 && !bVar2;
  case 0xc:
    dVar25 = 0.0;
    if (this == (anon_unknown_0 *)0x0 || a == (uint8_t *)0x0) {
      if (key == (FieldDef *)0x0) {
        pcVar20 = "bool flatbuffers::StringToFloatImpl(T *, const char *const) [T = double]";
        goto LAB_00125596;
      }
      dVar25 = strtod_l((char *)key,(char **)&local_28,ClassicLocale::instance_);
      dVar26 = 0.0;
      if (((local_28 != key) &&
          (*(char *)&(local_28->super_Definition).name._M_dataplus._M_p == '\0')) &&
         (dVar26 = dVar25, NAN(dVar25))) {
        dVar26 = NAN;
      }
      dVar25 = dVar26;
      if (this != (anon_unknown_0 *)0x0) goto LAB_00124ef5;
    }
    else {
LAB_00124ef5:
      dVar26 = *(double *)this;
    }
    if (a != (uint8_t *)0x0) {
      dVar25 = *(double *)a;
    }
    bVar2 = dVar25 == dVar26;
    bVar22 = dVar25 < dVar26;
    goto LAB_00124f07;
  default:
    __assert_fail("false && \"scalar type expected\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                  ,0xda,
                  "bool flatbuffers::(anonymous namespace)::CompareSerializedScalars(const uint8_t *, const uint8_t *, const FieldDef &)"
                 );
  }
  aVar14 = (anon_unknown_0)0x0;
  goto LAB_001251f0;
LAB_00125181:
  if ((bVar13 != 0x30) || ((*pbVar10 & 0xdf) != 0x58)) goto LAB_001251ac;
  iVar21 = 0x10;
LAB_001251c8:
  uVar12 = strtoll_l((char *)key,(char **)&local_28,iVar21,ClassicLocale::instance_);
  uVar19 = 0;
  if (((local_28 != key) && (*(char *)&(local_28->super_Definition).name._M_dataplus._M_p == '\0'))
     && (uVar19 = 0xff, uVar12 < 0xff)) {
    uVar19 = uVar12;
  }
  aVar3 = SUB81(uVar19,0);
  aVar14 = aVar3;
  if (this == (anon_unknown_0 *)0x0) goto LAB_001251f3;
LAB_001251f0:
  aVar3 = *this;
LAB_001251f3:
  if (a != (uint8_t *)0x0) {
    aVar14 = (anon_unknown_0)*a;
  }
  return (byte)aVar3 < (byte)aVar14;
}

Assistant:

static bool CompareSerializedScalars(const uint8_t *a, const uint8_t *b,
                                     const FieldDef &key) {
  switch (key.value.type.base_type) {
#define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...)                       \
  case BASE_TYPE_##ENUM: {                                              \
    CTYPE def = static_cast<CTYPE>(0);                                  \
    if (!a || !b) { StringToNumber(key.value.constant.c_str(), &def); } \
    const auto av = a ? ReadScalar<CTYPE>(a) : def;                     \
    const auto bv = b ? ReadScalar<CTYPE>(b) : def;                     \
    return av < bv;                                                     \
  }
    FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
#undef FLATBUFFERS_TD
    default: {
      FLATBUFFERS_ASSERT(false && "scalar type expected");
      return false;
    }
  }
}